

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_write_qcc(opj_j2k_t *j2k,int compno)

{
  int pos;
  int iVar1;
  long in_RDI;
  opj_cio_t *cio;
  opj_j2k_t *in_stack_00000010;
  int len;
  int lenp;
  int in_stack_ffffffffffffffdc;
  opj_cio_t *cio_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  cio_write((opj_cio_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
            (unsigned_long_long)cio_00,in_stack_ffffffffffffffdc);
  pos = cio_tell(cio_00);
  cio_skip(cio_00,2);
  cio_write((opj_cio_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
            (unsigned_long_long)cio_00,in_stack_ffffffffffffffdc);
  j2k_write_qcx(in_stack_00000010,cio._4_4_);
  iVar1 = cio_tell(cio_00);
  iVar1 = iVar1 - pos;
  cio_seek(cio_00,pos);
  cio_write((opj_cio_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),(unsigned_long_long)cio_00,
            in_stack_ffffffffffffffdc);
  cio_seek(cio_00,pos + iVar1);
  return;
}

Assistant:

static void j2k_write_qcc(opj_j2k_t *j2k, int compno) {
	int lenp, len;

	opj_cio_t *cio = j2k->cio;
	
	cio_write(cio, J2K_MS_QCC, 2);	/* QCC */
	lenp = cio_tell(cio);
	cio_skip(cio, 2);
	cio_write(cio, compno, j2k->image->numcomps <= 256 ? 1 : 2);	/* Cqcc */
	j2k_write_qcx(j2k, compno);
	len = cio_tell(cio) - lenp;
	cio_seek(cio, lenp);
	cio_write(cio, len, 2);			/* Lqcc */
	cio_seek(cio, lenp + len);
}